

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O1

void radio_number(t_radio *x,t_floatarg num)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (1 < (int)num) {
    iVar2 = (int)num;
  }
  if (0x7f < iVar2) {
    iVar2 = 0x80;
  }
  if (iVar2 != x->x_number) {
    iVar1 = glist_isvisible((x->x_gui).x_glist);
    if (iVar1 != 0) {
      (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,4);
    }
    x->x_number = iVar2;
    if (iVar2 <= x->x_on) {
      x->x_on = iVar2 + -1;
    }
    x->x_on_old = x->x_on;
    if (iVar1 != 0) {
      iVar2 = gobj_shouldvis((t_gobj *)x,(x->x_gui).x_glist);
      if (iVar2 != 0) {
        (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,2);
        canvas_fixlinesfor((x->x_gui).x_glist,(t_text *)x);
        return;
      }
    }
  }
  return;
}

Assistant:

static void radio_number(t_radio *x, t_floatarg num)
{
    int n = (int)num;

    if(n < 1)
        n = 1;
    if(n > IEM_RADIO_MAX)
        n = IEM_RADIO_MAX;
    if(n != x->x_number)
    {
        int vis = glist_isvisible(x->x_gui.x_glist);
        if(vis)
            (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_ERASE);
        x->x_number = n;
        if(x->x_on >= x->x_number)
            x->x_on = x->x_number - 1;
        x->x_on_old = x->x_on;
        if(vis && gobj_shouldvis((t_gobj *)x, x->x_gui.x_glist))
        {
            (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_NEW);
            canvas_fixlinesfor(x->x_gui.x_glist, (t_text*)x);
        }
    }
}